

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O3

bool QSystemSemaphore::isKeyTypeSupported(Type type)

{
  bool bVar1;
  undefined2 in_register_0000003a;
  
  if (CONCAT22(in_register_0000003a,type) == 0x101) {
    return false;
  }
  if (CONCAT22(in_register_0000003a,type) != 0x100) {
    bVar1 = QSystemSemaphoreSystemV::runtimeSupportCheck();
    return bVar1;
  }
  if (QSystemSemaphorePosix::runtimeSupportCheck()::result == '\0') {
    QSystemSemaphorePosix::runtimeSupportCheck();
  }
  return QSystemSemaphorePosix::runtimeSupportCheck::result;
}

Assistant:

bool QSystemSemaphore::isKeyTypeSupported(QNativeIpcKey::Type type)
{
    if (!isIpcSupported(IpcType::SystemSemaphore, type))
        return false;
    using Variant = decltype(QSystemSemaphorePrivate::backend);
    return Variant::staticVisit(type, [](auto ptr) {
        using Impl = std::decay_t<decltype(*ptr)>;
        return Impl::runtimeSupportCheck();
    });
}